

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff_igen_chunk.cpp
# Opt level: O0

void __thiscall sf2cute::SFRIFFIgenChunk::Write(SFRIFFIgenChunk *this,ostream *out)

{
  undefined8 uVar1;
  int iVar2;
  ostream *poVar3;
  bool bVar4;
  GenAmountType amount;
  SFGenerator SVar5;
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  *this_00;
  __shared_ptr_access<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar6;
  SFInstrumentZone *pSVar7;
  reference ppSVar8;
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  *this_02;
  reference this_03;
  pointer pSVar9;
  vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  *pvVar10;
  unordered_map<const_sf2cute::SFSample_*,_unsigned_short,_std::hash<const_sf2cute::SFSample_*>,_std::equal_to<const_sf2cute::SFSample_*>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>_>
  *puVar11;
  size_type sVar12;
  mapped_type *pmVar13;
  out_of_range *this_04;
  invalid_argument *piVar14;
  exception *anon_var_0;
  element_type *local_140;
  GenAmountType local_132;
  element_type *peStack_130;
  GenAmountType sample_index;
  undefined1 local_128 [24];
  shared_ptr<sf2cute::SFSample> *sample;
  pointer local_108;
  SFGeneratorItem **generator_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_> *__range4_1;
  unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_> *zone;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  *__range3;
  SFGeneratorItem **generator;
  iterator __end4;
  iterator __begin4;
  vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_> *__range4;
  shared_ptr<sf2cute::SFInstrument> *instrument;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  *__range2;
  string local_40;
  undefined4 local_1c;
  ostream *poStack_18;
  iostate old_exception_bits;
  ostream *out_local;
  SFRIFFIgenChunk *this_local;
  
  poStack_18 = out;
  out_local = (ostream *)this;
  local_1c = std::ios::exceptions();
  uVar1 = *(undefined8 *)(*(long *)poStack_18 + -0x18);
  iVar2 = (int)poStack_18;
  std::operator|(_S_badbit,_S_failbit);
  std::ios::exceptions(iVar2 + (int)uVar1);
  poVar3 = poStack_18;
  (*(this->super_RIFFChunkInterface)._vptr_RIFFChunkInterface[2])(&local_40);
  RIFFChunk::WriteHeader(poVar3,&local_40,this->size_);
  std::__cxx11::string::~string((string *)&local_40);
  this_00 = instruments(this);
  __end2 = std::
           vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
           ::begin(this_00);
  instrument = (shared_ptr<sf2cute::SFInstrument> *)
               std::
               vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
               ::end(this_00);
  do {
    bVar4 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<sf2cute::SFInstrument>_*,_std::vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>_>
                                *)&instrument);
    poVar3 = poStack_18;
    if (!bVar4) {
      GenAmountType::GenAmountType((GenAmountType *)((long)&anon_var_0 + 4),0);
      WriteItem(poVar3,kStartAddrsOffset,anon_var_0._4_2_);
      if ((this->size_ & 1) != 0) {
        InsertInt8<std::ostream>(poStack_18,'\0');
      }
      return;
    }
    this_01 = (__shared_ptr_access<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<const_std::shared_ptr<sf2cute::SFInstrument>_*,_std::vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>_>
                 ::operator*(&__end2);
    peVar6 = std::
             __shared_ptr_access<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_01);
    bVar4 = SFInstrument::has_global_zone(peVar6);
    if (bVar4) {
      peVar6 = std::
               __shared_ptr_access<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_01);
      pSVar7 = SFInstrument::global_zone(peVar6);
      bVar4 = SFInstrumentZone::has_sample(pSVar7);
      if (bVar4) {
        piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar14,"Global instrument zone cannot have a link to a sample.");
        __cxa_throw(piVar14,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      peVar6 = std::
               __shared_ptr_access<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_01);
      pSVar7 = SFInstrument::global_zone(peVar6);
      pvVar10 = SFZone::generators(&pSVar7->super_SFZone);
      SortGenerators((vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>
                      *)&__begin4,pvVar10);
      __end4 = std::vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>
               ::begin((vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>
                        *)&__begin4);
      generator = (SFGeneratorItem **)
                  std::
                  vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>::
                  end((vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>
                       *)&__begin4);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<sf2cute::SFGeneratorItem_**,_std::vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>_>
                                         *)&generator), bVar4) {
        ppSVar8 = __gnu_cxx::
                  __normal_iterator<sf2cute::SFGeneratorItem_**,_std::vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>_>
                  ::operator*(&__end4);
        poVar3 = poStack_18;
        SVar5 = SFGeneratorItem::op(*ppSVar8);
        amount = SFGeneratorItem::amount(*ppSVar8);
        WriteItem(poVar3,SVar5,amount);
        __gnu_cxx::
        __normal_iterator<sf2cute::SFGeneratorItem_**,_std::vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>_>
        ::operator++(&__end4);
      }
      std::vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>::~vector
                ((vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_> *)
                 &__begin4);
    }
    peVar6 = std::
             __shared_ptr_access<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_01);
    this_02 = SFInstrument::zones(peVar6);
    __end3 = std::
             vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
             ::begin(this_02);
    zone = (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_> *
           )std::
            vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
            ::end(this_02);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_*,_std::vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>_>
                                       *)&zone), bVar4) {
      this_03 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_*,_std::vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>_>
                ::operator*(&__end3);
      pSVar9 = std::
               unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
               ::operator->(this_03);
      pvVar10 = SFZone::generators(&pSVar9->super_SFZone);
      SortGenerators((vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>
                      *)&__begin4_1,pvVar10);
      __end4_1 = std::
                 vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>::
                 begin((vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>
                        *)&__begin4_1);
      generator_1 = (SFGeneratorItem **)
                    std::
                    vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>
                    ::end((vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>
                           *)&__begin4_1);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end4_1,
                                (__normal_iterator<sf2cute::SFGeneratorItem_**,_std::vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>_>
                                 *)&generator_1), bVar4) {
        local_108 = (pointer)__gnu_cxx::
                             __normal_iterator<sf2cute::SFGeneratorItem_**,_std::vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>_>
                             ::operator*(&__end4_1);
        poVar3 = poStack_18;
        SVar5 = SFGeneratorItem::op((SFGeneratorItem *)
                                    (local_108->_M_t).
                                    super___uniq_ptr_impl<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_sf2cute::SFModulatorItem_*,_std::default_delete<sf2cute::SFModulatorItem>_>
                                    .super__Head_base<0UL,_sf2cute::SFModulatorItem_*,_false>.
                                    _M_head_impl);
        sample._6_2_ = SFGeneratorItem::amount
                                 ((SFGeneratorItem *)
                                  (local_108->_M_t).
                                  super___uniq_ptr_impl<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_sf2cute::SFModulatorItem_*,_std::default_delete<sf2cute::SFModulatorItem>_>
                                  .super__Head_base<0UL,_sf2cute::SFModulatorItem_*,_false>.
                                  _M_head_impl);
        WriteItem(poVar3,SVar5,sample._6_2_);
        __gnu_cxx::
        __normal_iterator<sf2cute::SFGeneratorItem_**,_std::vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>_>
        ::operator++(&__end4_1);
      }
      std::vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>::~vector
                ((vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_> *)
                 &__begin4_1);
      pSVar9 = std::
               unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
               ::operator->(this_03);
      bVar4 = SFInstrumentZone::has_sample(pSVar9);
      if (!bVar4) {
        piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar14,"Instrument zone must have a link to a sample.");
        __cxa_throw(piVar14,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>::
      operator->(this_03);
      SFInstrumentZone::sample((SFInstrumentZone *)local_128);
      local_128._16_8_ = (SFInstrumentZone *)local_128;
      puVar11 = sample_index_map(this);
      peStack_130 = std::__shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>::get
                              ((__shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2> *)
                               local_128._16_8_);
      sVar12 = std::
               unordered_map<const_sf2cute::SFSample_*,_unsigned_short,_std::hash<const_sf2cute::SFSample_*>,_std::equal_to<const_sf2cute::SFSample_*>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>_>
               ::count(puVar11,&stack0xfffffffffffffed0);
      if (sVar12 == 0) {
        this_04 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this_04,"Instrument zone points to an unknown sample.");
        __cxa_throw(this_04,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      puVar11 = sample_index_map(this);
      local_140 = std::__shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2> *)
                             local_128._16_8_);
      pmVar13 = std::
                unordered_map<const_sf2cute::SFSample_*,_unsigned_short,_std::hash<const_sf2cute::SFSample_*>,_std::equal_to<const_sf2cute::SFSample_*>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>_>
                ::at(puVar11,&local_140);
      GenAmountType::GenAmountType((GenAmountType *)&local_132.range,*pmVar13);
      anon_var_0._6_2_ = local_132;
      WriteItem(poStack_18,kSampleID,local_132);
      std::shared_ptr<sf2cute::SFSample>::~shared_ptr((shared_ptr<sf2cute::SFSample> *)local_128);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_*,_std::vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<sf2cute::SFInstrument>_*,_std::vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void SFRIFFIgenChunk::Write(std::ostream & out) const {
  // Save exception bits of output stream.
  const std::ios_base::iostate old_exception_bits = out.exceptions();
  // Set exception bits to get output error as an exception.
  out.exceptions(std::ios::badbit | std::ios::failbit);

  try {
    // Write the chunk header.
    RIFFChunk::WriteHeader(out, name(), size_);

    // Instruments:
    for (const auto & instrument : instruments()) {
      // Global zone:
      if (instrument->has_global_zone()) {
        // Check the sample for the global zone.
        if (instrument->global_zone().has_sample()) {
          // Throw exception if the global zone has a link to a sample.
          throw std::invalid_argument("Global instrument zone cannot have a link to a sample.");
        }

        // Write all the generators in the global zone.
        for (const auto & generator : SortGenerators(instrument->global_zone().generators())) {
          WriteItem(out, generator->op(), generator->amount());
        }
      }

      // Instrument zones:
      for (const auto & zone : instrument->zones()) {
        // Write all the generators in the instrument zone.
        for (const auto & generator : SortGenerators(zone->generators())) {
          WriteItem(out, generator->op(), generator->amount());
        }

        // Check the sample for the zone.
        if (zone->has_sample()) {
          // Find the index number for the sample.
          const auto & sample = zone->sample();
          if (sample_index_map().count(sample.get()) != 0) {
            // Write the sampleID generator.
            GenAmountType sample_index(sample_index_map().at(sample.get()));
            WriteItem(out, SFGenerator::kSampleID, sample_index);
          }
          else {
            // Throw exception if the sample could not be found in the index map.
            throw std::out_of_range("Instrument zone points to an unknown sample.");
          }
        }
        else {
          // Throw exception if the instrument zone does not have a link to a sample.
          throw std::invalid_argument("Instrument zone must have a link to a sample.");
        }
      }
    }

    // Write the last terminator item.
    WriteItem(out, SFGenerator(0), GenAmountType(0));

    // Write a padding byte if necessary.
    if (size_ % 2 != 0) {
      InsertInt8(out, 0);
    }
  }
  catch (const std::exception &) {
    // Recover exception bits of output stream.
    out.exceptions(old_exception_bits);

    // Rethrow the exception.
    throw;
  }
}